

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3SafetyCheckSickOrOk(sqlite3 *db)

{
  char cVar1;
  long in_RDI;
  u8 eOpenState;
  undefined4 local_4;
  
  cVar1 = *(char *)(in_RDI + 0x71);
  if (((cVar1 == -0x46) || (cVar1 == 'v')) || (cVar1 == 'm')) {
    local_4 = 1;
  }
  else {
    logBadConnection((char *)0x14cb26);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3SafetyCheckSickOrOk(sqlite3 *db){
  u8 eOpenState;
  eOpenState = db->eOpenState;
  if( eOpenState!=SQLITE_STATE_SICK &&
      eOpenState!=SQLITE_STATE_OPEN &&
      eOpenState!=SQLITE_STATE_BUSY ){
    testcase( sqlite3GlobalConfig.xLog!=0 );
    logBadConnection("invalid");
    return 0;
  }else{
    return 1;
  }
}